

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

TypedName * __thiscall
VkSpecParser::parseParamOrProto(TypedName *__return_storage_ptr__,VkSpecParser *this,QString *tag)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  int iVar6;
  short *psVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  undefined1 auVar13 [16];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->type).d.d = (Data *)0x0;
  (__return_storage_ptr__->type).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->type).d.size = 0;
  (__return_storage_ptr__->typeSuffix).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeSuffix).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->typeSuffix).d.size = 0;
  cVar5 = QXmlStreamReader::atEnd();
  if (cVar5 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar6 = QXmlStreamReader::tokenType();
      if (iVar6 == 5) {
        QVar12 = (QStringView)QXmlStreamReader::name();
        lVar1 = (tag->d).size;
        if (QVar12.m_size == lVar1) {
          QVar9.m_data = (tag->d).ptr;
          QVar9.m_size = lVar1;
          cVar5 = QtPrivate::equalStrings(QVar12,QVar9);
          if (cVar5 != '\0') break;
        }
      }
      iVar6 = QXmlStreamReader::tokenType();
      if (iVar6 == 4) {
        auVar13 = QXmlStreamReader::name();
        if (auVar13._0_8_ == 4) {
          QVar12.m_data = auVar13._8_8_;
          QVar12.m_size = 4;
          QVar10.m_data = L"name";
          QVar10.m_size = 4;
          cVar5 = QtPrivate::equalStrings(QVar12,QVar10);
          if (cVar5 != '\0') {
            parseName(&local_58,this);
            pQVar2 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
            pcVar3 = (__return_storage_ptr__->name).d.ptr;
            (__return_storage_ptr__->name).d.d = local_58.d.d;
            (__return_storage_ptr__->name).d.ptr = local_58.d.ptr;
            qVar4 = (__return_storage_ptr__->name).d.size;
            (__return_storage_ptr__->name).d.size = local_58.d.size;
            local_58.d.d = (Data *)pQVar2;
            local_58.d.ptr = pcVar3;
            local_58.d.size = qVar4;
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar2,2,0x10);
              }
            }
            goto LAB_001041b0;
          }
        }
        auVar13 = QXmlStreamReader::name();
        if (auVar13._0_8_ == 4) {
          QVar8.m_data = auVar13._8_8_;
          QVar8.m_size = 4;
          QVar11.m_data = L"type";
          QVar11.m_size = 4;
          cVar5 = QtPrivate::equalStrings(QVar8,QVar11);
          if (cVar5 != '\0') goto LAB_001041b0;
        }
        skip(this);
      }
      else {
        QVar12 = (QStringView)QXmlStreamReader::text();
        auVar13 = QtPrivate::trimmed(QVar12);
        psVar7 = auVar13._8_8_;
        if (auVar13._0_8_ != 0) {
          if (*psVar7 == 0x5b) {
            QString::append((QChar *)&__return_storage_ptr__->typeSuffix,(longlong)psVar7);
          }
          else {
            if ((__return_storage_ptr__->type).d.size != 0) {
              QString::append((QChar)(char16_t)&__return_storage_ptr__->type);
            }
            QString::append((QChar *)&__return_storage_ptr__->type,(longlong)psVar7);
          }
        }
      }
LAB_001041b0:
      cVar5 = QXmlStreamReader::atEnd();
    } while (cVar5 == '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::TypedName VkSpecParser::parseParamOrProto(const QString &tag)
{
    TypedName t;

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("name")) {
                t.name = parseName();
            } else if (m_reader.name() != QStringLiteral("type")) {
                skip();
            }
        } else {
            auto text = m_reader.text().trimmed();
            if (!text.isEmpty()) {
                if (text.startsWith(u'[')) {
                    t.typeSuffix += text;
                } else {
                    if (!t.type.isEmpty())
                        t.type += u' ';
                    t.type += text;
                }
            }
        }
    }

    return t;
}